

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binding_map.h
# Opt level: O2

void __thiscall r_exec::AtomValue::~AtomValue(AtomValue *this)

{
  ~AtomValue(this);
  operator_delete(this);
  return;
}

Assistant:

class REPLICODE_EXPORT AtomValue:
    public BoundValue
{
private:
    r_code::Atom atom;
public:
    AtomValue(BindingMap *map, r_code::Atom atom);

    Value *copy(BindingMap *map) const;
    void valuate(r_code::Code *destination, uint16_t write_index, uint16_t &extent_index) const;
    bool match(const r_code::Code *object, uint16_t index);
    r_code::Atom *get_code();
    r_code::Code *get_object();
    uint16_t get_code_size();

    bool intersect(const Value *v) const;
    bool _intersect(const AtomValue *v) const;

    bool contains(const r_code::Atom a) const;
}